

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<char32_t> * __thiscall
kj::ArrayBuilder<char32_t>::operator=(ArrayBuilder<char32_t> *this,ArrayBuilder<char32_t> *other)

{
  ArrayBuilder<char32_t> *other_local;
  ArrayBuilder<char32_t> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (char32_t *)0x0;
  other->pos = (RemoveConst<char32_t> *)0x0;
  other->endPtr = (char32_t *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }